

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_single_path.cpp
# Opt level: O2

void __thiscall agg::trans_single_path::move_to(trans_single_path *this,double x,double y)

{
  vertex_dist local_20;
  
  if (this->m_status != initial) {
    line_to(this,x,y);
    return;
  }
  local_20.dist = 0.0;
  local_20.x = x;
  local_20.y = y;
  vertex_sequence<agg::vertex_dist,_6U>::modify_last(&this->m_src_vertices,&local_20);
  this->m_status = making_path;
  return;
}

Assistant:

void trans_single_path::move_to(double x, double y)
    {
        if(m_status == initial)
        {
            m_src_vertices.modify_last(vertex_dist(x, y));
            m_status = making_path;
        }
        else
        {
            line_to(x, y);
        }
    }